

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void spvtools::utils::PrintTimerDescription(ostream *out,bool measure_mem_usage)

{
  ostream *poVar1;
  
  if (out != (ostream *)0x0) {
    *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0x1e;
    poVar1 = std::operator<<(out,"PASS name");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
    poVar1 = std::operator<<(poVar1,"CPU time");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
    poVar1 = std::operator<<(poVar1,"WALL time");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
    poVar1 = std::operator<<(poVar1,"USR time");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
    std::operator<<(poVar1,"SYS time");
    if (measure_mem_usage) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 0xc;
      poVar1 = std::operator<<(out,"RSS delta");
      *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0x10;
      std::operator<<(poVar1,"PGFault delta");
    }
    std::endl<char,std::char_traits<char>>(out);
    return;
  }
  return;
}

Assistant:

void PrintTimerDescription(std::ostream* out, bool measure_mem_usage) {
  if (out) {
    *out << std::setw(30) << "PASS name" << std::setw(12) << "CPU time"
         << std::setw(12) << "WALL time" << std::setw(12) << "USR time"
         << std::setw(12) << "SYS time";
    if (measure_mem_usage) {
      *out << std::setw(12) << "RSS delta" << std::setw(16) << "PGFault delta";
    }
    *out << std::endl;
  }
}